

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_11b0 [8];
  Emulator emu;
  char **argv_local;
  int argc_local;
  
  emu.sdl._72_8_ = argv;
  if (argc != 2) {
    fprintf(_stderr,"Usage: %s romfile\n",*argv);
    exit(1);
  }
  printf("Loading %s\n",argv[1]);
  Emulator::Emulator((Emulator *)local_11b0,*(char **)(emu.sdl._72_8_ + 8));
  Emulator::run((Emulator *)local_11b0,3000);
  printf("DONE\n");
  Emulator::~Emulator((Emulator *)local_11b0);
  return 0;
}

Assistant:

int main(int argc, char** argv){
	if (argc != 2){
		fprintf(stderr, "Usage: %s romfile\n", argv[0]);
		exit(EXIT_FAILURE);
	}
	
	printf("Loading %s\n", argv[1]);

	Emulator emu(argv[1]);
	emu.run(3000); // This can be changed for faster or slower game
	printf("DONE\n");
}